

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O0

void amrex::EB_interp_CellCentroid_to_FaceCentroid
               (MultiFab *phi_centroid,MultiFab *phi_xface,MultiFab *phi_yface,MultiFab *phi_zface,
               int scomp,int dcomp,int ncomp,Geometry *a_geom,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *a_bcs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  FabFactory<amrex::FArrayBox> *pFVar6;
  Long LVar7;
  Box *pBVar8;
  Periodicity *in_RCX;
  int in_stack_00000008;
  Geometry *in_stack_00000010;
  Box tzbx_1;
  iterator __end5_5;
  iterator __begin5_5;
  range_impl<amrex::Box> *__range5_5;
  Box tybx_1;
  iterator __end5_4;
  iterator __begin5_4;
  range_impl<amrex::Box> *__range5_4;
  Box txbx_1;
  iterator __end5_3;
  iterator __begin5_3;
  range_impl<amrex::Box> *__range5_3;
  Array4<const_double> *cct;
  Array4<const_double> *cvol;
  Array4<const_double> *fcz;
  Array4<const_double> *fcy;
  Array4<const_double> *fcx;
  Array4<const_double> *apzfab;
  Array4<const_double> *apyfab;
  Array4<const_double> *apxfab;
  Box tzbx;
  iterator __end5_2;
  iterator __begin5_2;
  range_impl<amrex::Box> *__range5_2;
  Box tybx;
  iterator __end5_1;
  iterator __begin5_1;
  range_impl<amrex::Box> *__range5_1;
  Box txbx;
  iterator __end5;
  iterator __begin5;
  range_impl<amrex::Box> *__range5;
  Array4<double> *phi_z;
  Array4<double> *phi_y;
  Array4<double> *phi_x;
  Box result_1;
  FabType fabtyp_ghost;
  Box result;
  FabType fabtyp;
  Array4<const_double> *ccfab;
  Box *zbx;
  Box *ybx;
  Box *xbx;
  Box *vbx;
  MFIter mfi;
  MFItInfo mfi_info;
  BCRec *d_bcs;
  int nghost;
  Box domain;
  MultiCutFab *ccent;
  Array<const_MultiCutFab_*,_3> *fcent;
  Array<const_MultiCutFab_*,_3> *area;
  MultiFab *vfrac;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  Dim3 domhi;
  Dim3 domlo;
  Dim3 domhi_1;
  Dim3 domlo_1;
  Dim3 domhi_2;
  Dim3 domlo_2;
  Dim3 domhi_3;
  Dim3 domlo_3;
  Dim3 domhi_4;
  Dim3 domlo_4;
  Dim3 domhi_5;
  Dim3 domlo_5;
  MFIter *in_stack_ffffffffffffe828;
  MultiCutFab *in_stack_ffffffffffffe830;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe838;
  undefined4 in_stack_ffffffffffffe840;
  undefined4 in_stack_ffffffffffffe844;
  undefined1 cross;
  Periodicity *in_stack_ffffffffffffe848;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe850;
  FabArrayBase *in_stack_ffffffffffffe858;
  undefined4 in_stack_ffffffffffffe860;
  int in_stack_ffffffffffffe864;
  undefined4 in_stack_ffffffffffffe878;
  int in_stack_ffffffffffffe87c;
  Box *in_stack_ffffffffffffe880;
  Box *in_stack_ffffffffffffe888;
  undefined4 in_stack_ffffffffffffe890;
  int in_stack_ffffffffffffe894;
  MFIter *in_stack_ffffffffffffe898;
  MFIter *in_stack_ffffffffffffe8a0;
  undefined4 in_stack_ffffffffffffe950;
  undefined4 in_stack_ffffffffffffe954;
  EBCellFlagFab *in_stack_ffffffffffffe958;
  iterator local_1690;
  iterator local_1678;
  undefined1 local_1660 [40];
  undefined1 *local_1638;
  Box local_162c;
  iterator local_1610;
  iterator local_15f8 [2];
  char *in_stack_ffffffffffffea48;
  int in_stack_ffffffffffffea54;
  char *in_stack_ffffffffffffea58;
  char *in_stack_ffffffffffffea60;
  iterator local_1590;
  iterator local_1578;
  undefined1 local_1560 [40];
  undefined1 *local_1538;
  undefined1 local_1530 [64];
  undefined1 *local_14f0;
  undefined1 local_14e8 [64];
  undefined1 *local_14a8;
  undefined1 local_14a0 [64];
  undefined1 *local_1460;
  undefined1 local_1458 [64];
  undefined1 *local_1418;
  undefined1 local_1410 [64];
  undefined1 *local_13d0;
  undefined1 local_13c8 [64];
  undefined1 *local_1388;
  undefined1 local_1380 [64];
  undefined1 *local_1340;
  undefined1 local_1338 [64];
  undefined1 *local_12f8;
  undefined1 local_12ec [52];
  iterator local_12b8;
  undefined1 local_12a0 [40];
  undefined1 *local_1278;
  Box local_126c;
  iterator local_1250;
  iterator local_1238;
  undefined1 local_1220 [40];
  undefined1 *local_11f8;
  Box local_11ec;
  iterator local_11d0;
  iterator local_11b8;
  undefined1 local_11a0 [40];
  undefined1 *local_1178;
  undefined1 local_1170 [64];
  undefined1 *local_1130;
  undefined1 local_1128 [64];
  undefined1 *local_10e8;
  undefined1 local_10e0 [64];
  undefined1 *local_10a0;
  Box local_1098;
  FabType local_107c;
  Box local_1078;
  FabType local_105c;
  undefined1 local_1058 [64];
  undefined1 *local_1018;
  undefined1 local_100c [28];
  undefined1 *local_ff0;
  undefined1 local_fe4 [28];
  undefined1 *local_fc8;
  undefined1 local_fbc [28];
  undefined1 *local_fa0;
  int local_f94 [7];
  int *local_f78;
  MFIter local_f70;
  MFItInfo local_f0c;
  BCRec *local_ef8;
  undefined4 local_ef0;
  undefined8 local_eec;
  undefined8 local_ee4;
  undefined8 local_edc;
  uint local_ed4;
  MultiCutFab *local_ed0;
  undefined1 local_ec8 [24];
  undefined1 *local_eb0;
  undefined1 local_ea8 [24];
  undefined1 *local_e90;
  MultiFab *local_e88;
  FabArray<amrex::EBCellFlagFab> *local_e80;
  long local_e78;
  Periodicity *local_e68;
  undefined8 local_e48;
  undefined4 local_e3c;
  char *local_e38;
  char *local_e30;
  undefined4 local_e24;
  int *local_e20;
  undefined4 local_e14;
  int *local_e10;
  undefined8 local_e08;
  undefined8 local_e00;
  BCRec *local_df8;
  undefined1 auStack_df0 [64];
  undefined1 auStack_db0 [64];
  undefined8 local_d70;
  undefined4 local_d68;
  undefined8 local_d60;
  undefined4 local_d58;
  undefined8 local_d4c;
  undefined4 local_d44;
  undefined8 local_d40;
  undefined8 local_d38;
  undefined8 local_d30;
  undefined8 local_d28;
  BCRec *local_d20;
  undefined8 *local_d18;
  undefined1 *local_d08;
  undefined1 *local_d00;
  Box *local_cf8;
  undefined8 local_cf0;
  undefined8 local_ce8;
  undefined8 *local_ce0;
  undefined4 local_cd4;
  undefined4 uStack_cd0;
  undefined1 local_ccc [12];
  undefined4 local_cc0;
  undefined8 *local_cb8;
  undefined4 local_cac;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 local_c98;
  BCRec *local_c90;
  undefined1 auStack_c88 [64];
  undefined1 auStack_c48 [64];
  undefined8 local_c08;
  undefined4 local_c00;
  undefined8 local_bf8;
  undefined4 local_bf0;
  undefined8 local_be4;
  undefined4 local_bdc;
  undefined8 local_bd8;
  undefined8 local_bd0;
  undefined8 local_bc8;
  undefined8 local_bc0;
  BCRec *local_bb8;
  undefined8 *local_bb0;
  undefined1 *local_ba0;
  undefined1 *local_b98;
  Box *local_b90;
  undefined8 local_b88;
  undefined8 local_b80;
  undefined8 *local_b78;
  undefined4 local_b6c;
  undefined4 uStack_b68;
  undefined1 local_b64 [12];
  undefined4 local_b58;
  undefined8 *local_b50;
  undefined4 local_b44;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 local_b30;
  BCRec *local_b28;
  undefined1 auStack_b20 [64];
  undefined1 auStack_ae0 [64];
  undefined8 local_aa0;
  undefined4 local_a98;
  undefined8 local_a90;
  undefined4 local_a88;
  undefined8 local_a7c;
  undefined4 local_a74;
  undefined8 local_a70;
  undefined8 local_a68;
  undefined8 local_a60;
  undefined8 local_a58;
  BCRec *local_a50;
  undefined8 *local_a48;
  undefined1 *local_a38;
  undefined1 *local_a30;
  MFIter *local_a28;
  undefined8 local_a20;
  undefined8 local_a18;
  undefined8 *local_a10;
  undefined4 local_a04;
  undefined4 uStack_a00;
  undefined1 local_9fc [12];
  undefined4 local_9f0;
  undefined8 *local_9e8;
  undefined4 local_9dc;
  undefined8 uStack_9d8;
  undefined1 local_9d0 [64];
  undefined1 auStack_990 [64];
  undefined8 local_950;
  undefined8 local_948;
  BCRec *local_940;
  undefined1 auStack_938 [64];
  undefined8 local_8f8;
  undefined4 local_8f0;
  undefined1 auStack_8e8 [64];
  undefined1 auStack_8a8 [64];
  undefined1 auStack_868 [64];
  undefined8 local_828;
  undefined4 local_820;
  undefined8 local_814;
  undefined4 local_80c;
  undefined8 local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined8 local_7f0;
  BCRec *local_7e8;
  undefined8 *local_7e0;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  Box *local_7a0;
  undefined8 local_798;
  undefined8 local_790;
  undefined8 *local_788;
  undefined4 local_77c;
  undefined4 uStack_778;
  undefined1 local_774 [12];
  undefined4 local_768;
  undefined8 *local_760;
  undefined4 local_754;
  undefined8 uStack_750;
  undefined1 local_748 [64];
  undefined1 auStack_708 [64];
  undefined8 local_6c8;
  undefined8 local_6c0;
  BCRec *local_6b8;
  undefined1 auStack_6b0 [64];
  undefined8 local_670;
  undefined4 local_668;
  undefined1 auStack_660 [64];
  undefined1 auStack_620 [64];
  undefined1 auStack_5e0 [64];
  undefined8 local_5a0;
  undefined4 local_598;
  undefined8 local_58c;
  undefined4 local_584;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined8 local_568;
  BCRec *local_560;
  undefined8 *local_558;
  undefined1 *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  Box *local_518;
  undefined8 local_510;
  undefined8 local_508;
  undefined8 *local_500;
  undefined4 local_4f4;
  undefined4 uStack_4f0;
  undefined1 local_4ec [12];
  undefined4 local_4e0;
  undefined8 *local_4d8;
  undefined4 local_4cc;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [64];
  undefined1 auStack_480 [64];
  undefined8 local_440;
  undefined8 local_438;
  BCRec *local_430;
  undefined1 auStack_428 [64];
  undefined8 local_3e8;
  undefined4 local_3e0;
  undefined1 auStack_3d8 [64];
  undefined1 auStack_398 [64];
  undefined1 auStack_358 [64];
  undefined8 local_318;
  undefined4 local_310;
  undefined8 local_304;
  undefined4 local_2fc;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  BCRec *local_2d8;
  undefined8 *local_2d0;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  FabArray<amrex::FArrayBox> *local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 *local_278;
  undefined4 local_26c;
  undefined4 uStack_268;
  undefined1 local_264 [12];
  undefined4 local_258;
  undefined8 *local_250;
  undefined4 local_248;
  undefined8 uStack_244;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  long local_228;
  undefined4 local_21c;
  long local_218;
  undefined4 local_20c;
  undefined8 *local_208;
  undefined4 local_1fc;
  undefined8 *local_1f8;
  undefined4 local_1ec;
  undefined8 *local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  undefined4 local_1cc;
  long local_1c8;
  undefined4 local_1bc;
  long local_1b8;
  undefined4 local_1ac;
  undefined8 *local_1a8;
  undefined4 local_19c;
  undefined8 *local_198;
  undefined4 local_18c;
  undefined8 *local_188;
  undefined4 local_17c;
  long local_178;
  undefined4 local_16c;
  long local_168;
  undefined4 local_15c;
  long local_158;
  undefined4 local_14c;
  undefined8 *local_148;
  undefined4 local_13c;
  undefined8 *local_138;
  undefined4 local_12c;
  undefined8 *local_128;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined4 local_ec;
  undefined8 *local_e8;
  undefined4 local_dc;
  undefined8 *local_d8;
  undefined4 local_cc;
  undefined8 *local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  undefined8 *local_88;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_e68 = in_RCX;
  pFVar6 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x115ce3b);
  local_e78 = __dynamic_cast(pFVar6,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
  if (local_e78 != 0) {
    local_e80 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)in_stack_ffffffffffffe830);
    local_e88 = EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffe830);
    EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffe830);
    local_e90 = local_ea8;
    EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffe830);
    local_eb0 = local_ec8;
    local_ed0 = EBFArrayBoxFactory::getCentroid((EBFArrayBoxFactory *)in_stack_ffffffffffffe830);
    LVar7 = Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::size
                      ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x115cf0e);
    if (LVar7 < in_stack_00000008) {
      local_e30 = "a_bcs.size() >= ncomp";
      local_e38 = 
      "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EBMultiFabUtil.cpp"
      ;
      local_e3c = 0x426;
      local_e48 = 0;
      Assert_host(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea54,
                  in_stack_ffffffffffffea48);
    }
    pBVar8 = Geometry::Domain(in_stack_00000010);
    local_eec = *(undefined8 *)(pBVar8->smallend).vect;
    uVar1 = *(undefined8 *)((pBVar8->smallend).vect + 2);
    local_ee4._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    uVar2 = *(undefined8 *)((pBVar8->bigend).vect + 1);
    local_edc._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    local_ed4 = (pBVar8->btype).itype;
    local_ef0 = 4;
    uVar3 = local_ee4._4_4_;
    local_ee4 = uVar1;
    uVar4 = local_edc._4_4_;
    local_edc = uVar2;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
               (value_type)in_stack_ffffffffffffe858,(int)((ulong)in_stack_ffffffffffffe850 >> 0x20)
               ,(int)in_stack_ffffffffffffe850,(int)((ulong)in_stack_ffffffffffffe848 >> 0x20));
    uVar2 = local_edc;
    uVar1 = local_ee4;
    uVar3 = local_ee4._4_4_;
    local_ee4 = uVar1;
    uVar4 = local_edc._4_4_;
    local_edc = uVar2;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
               (value_type)in_stack_ffffffffffffe858,(int)((ulong)in_stack_ffffffffffffe850 >> 0x20)
               ,(int)in_stack_ffffffffffffe850,(int)((ulong)in_stack_ffffffffffffe848 >> 0x20));
    uVar2 = local_edc;
    uVar1 = local_ee4;
    uVar3 = local_ee4._4_4_;
    local_ee4 = uVar1;
    uVar4 = local_edc._4_4_;
    local_edc = uVar2;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
               (value_type)in_stack_ffffffffffffe858,(int)((ulong)in_stack_ffffffffffffe850 >> 0x20)
               ,(int)in_stack_ffffffffffffe850,(int)((ulong)in_stack_ffffffffffffe848 >> 0x20));
    uVar2 = local_edc;
    uVar1 = local_ee4;
    uVar3 = local_ee4._4_4_;
    local_ee4 = uVar1;
    uVar4 = local_edc._4_4_;
    local_edc = uVar2;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    local_ef8 = Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
                          ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x115d037);
    uVar2 = local_edc;
    uVar1 = local_ee4;
    uVar3 = local_ee4._4_4_;
    local_ee4 = uVar1;
    uVar4 = local_edc._4_4_;
    local_edc = uVar2;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    MFItInfo::MFItInfo((MFItInfo *)CONCAT44(in_stack_ffffffffffffe844,in_stack_ffffffffffffe840));
    uVar2 = local_edc;
    uVar1 = local_ee4;
    uVar3 = local_ee4._4_4_;
    local_ee4 = uVar1;
    uVar4 = local_edc._4_4_;
    local_edc = uVar2;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    MFItInfo::SetDynamic(&local_f0c,true);
    uVar2 = local_edc;
    uVar1 = local_ee4;
    uVar3 = local_ee4._4_4_;
    local_ee4 = uVar1;
    uVar4 = local_edc._4_4_;
    local_edc = uVar2;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    MFIter::MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
                   in_stack_ffffffffffffe858,(MFItInfo *)in_stack_ffffffffffffe850);
    uVar2 = local_edc;
    uVar1 = local_ee4;
    while (local_edc = uVar2, local_ee4 = uVar1, uVar4 = local_edc._4_4_, uVar3 = local_ee4._4_4_,
          uVar1 = local_ee4, local_ee4._4_4_ = uVar3, uVar2 = local_edc, local_edc._4_4_ = uVar4,
          bVar5 = MFIter::isValid(&local_f70), uVar2 = local_edc, uVar1 = local_ee4,
          local_ee4 = uVar1, local_edc = uVar2, bVar5) {
      uVar3 = local_ee4._4_4_;
      uVar4 = local_edc._4_4_;
      uVar1 = local_ee4;
      local_ee4._4_4_ = uVar3;
      uVar2 = local_edc;
      local_edc._4_4_ = uVar4;
      MFIter::tilebox((MFIter *)CONCAT44(in_stack_ffffffffffffe894,in_stack_ffffffffffffe890));
      uVar2 = local_edc;
      uVar1 = local_ee4;
      local_f78 = local_f94;
      uVar3 = local_ee4._4_4_;
      local_ee4 = uVar1;
      uVar4 = local_edc._4_4_;
      local_edc = uVar2;
      uVar1 = local_ee4;
      local_ee4._4_4_ = uVar3;
      uVar2 = local_edc;
      local_edc._4_4_ = uVar4;
      MFIter::nodaltilebox
                (in_stack_ffffffffffffe8a0,(int)((ulong)in_stack_ffffffffffffe898 >> 0x20));
      uVar2 = local_edc;
      uVar1 = local_ee4;
      local_fa0 = local_fbc;
      uVar3 = local_ee4._4_4_;
      local_ee4 = uVar1;
      uVar4 = local_edc._4_4_;
      local_edc = uVar2;
      uVar1 = local_ee4;
      local_ee4._4_4_ = uVar3;
      uVar2 = local_edc;
      local_edc._4_4_ = uVar4;
      MFIter::nodaltilebox
                (in_stack_ffffffffffffe8a0,(int)((ulong)in_stack_ffffffffffffe898 >> 0x20));
      uVar2 = local_edc;
      uVar1 = local_ee4;
      local_fc8 = local_fe4;
      uVar3 = local_ee4._4_4_;
      local_ee4 = uVar1;
      uVar4 = local_edc._4_4_;
      local_edc = uVar2;
      uVar1 = local_ee4;
      local_ee4._4_4_ = uVar3;
      uVar2 = local_edc;
      local_edc._4_4_ = uVar4;
      MFIter::nodaltilebox
                (in_stack_ffffffffffffe8a0,(int)((ulong)in_stack_ffffffffffffe898 >> 0x20));
      uVar2 = local_edc;
      uVar1 = local_ee4;
      local_ff0 = local_100c;
      uVar3 = local_ee4._4_4_;
      local_ee4 = uVar1;
      uVar4 = local_edc._4_4_;
      local_edc = uVar2;
      uVar1 = local_ee4;
      local_ee4._4_4_ = uVar3;
      uVar2 = local_edc;
      local_edc._4_4_ = uVar4;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffe844,in_stack_ffffffffffffe840),
                 (MFIter *)in_stack_ffffffffffffe838,(int)((ulong)in_stack_ffffffffffffe830 >> 0x20)
                );
      uVar2 = local_edc;
      uVar1 = local_ee4;
      local_1018 = local_1058;
      uVar3 = local_ee4._4_4_;
      local_ee4 = uVar1;
      uVar4 = local_edc._4_4_;
      local_edc = uVar2;
      uVar1 = local_ee4;
      local_ee4._4_4_ = uVar3;
      uVar2 = local_edc;
      local_edc._4_4_ = uVar4;
      FabArray<amrex::EBCellFlagFab>::operator[]
                ((FabArray<amrex::EBCellFlagFab> *)in_stack_ffffffffffffe830,
                 in_stack_ffffffffffffe828);
      uVar2 = local_edc;
      uVar1 = local_ee4;
      local_e10 = local_f78;
      local_e14 = 0;
      local_1078.smallend.vect._0_8_ = *(undefined8 *)local_f78;
      local_1078.smallend.vect[2] = local_f78[2];
      local_1078.bigend.vect[0] = local_f78[3];
      local_1078.bigend.vect._4_8_ = *(undefined8 *)(local_f78 + 4);
      local_1078.btype.itype = local_f78[6];
      uVar3 = local_ee4._4_4_;
      local_ee4 = uVar1;
      uVar4 = local_edc._4_4_;
      local_edc = uVar2;
      uVar1 = local_ee4;
      local_ee4._4_4_ = uVar3;
      uVar2 = local_edc;
      local_edc._4_4_ = uVar4;
      Box::grow(&local_1078,0);
      uVar2 = local_edc;
      uVar1 = local_ee4;
      uVar3 = local_ee4._4_4_;
      local_ee4 = uVar1;
      uVar4 = local_edc._4_4_;
      local_edc = uVar2;
      uVar1 = local_ee4;
      local_ee4._4_4_ = uVar3;
      uVar2 = local_edc;
      local_edc._4_4_ = uVar4;
      local_105c = EBCellFlagFab::getType
                             (in_stack_ffffffffffffe958,
                              (Box *)CONCAT44(in_stack_ffffffffffffe954,in_stack_ffffffffffffe950));
      uVar2 = local_edc;
      uVar1 = local_ee4;
      uVar3 = local_ee4._4_4_;
      local_ee4 = uVar1;
      uVar4 = local_edc._4_4_;
      local_edc = uVar2;
      uVar1 = local_ee4;
      local_ee4._4_4_ = uVar3;
      uVar2 = local_edc;
      local_edc._4_4_ = uVar4;
      FabArray<amrex::EBCellFlagFab>::operator[]
                ((FabArray<amrex::EBCellFlagFab> *)in_stack_ffffffffffffe830,
                 in_stack_ffffffffffffe828);
      uVar2 = local_edc;
      uVar1 = local_ee4;
      local_e20 = local_f78;
      local_e24 = 4;
      local_1098.smallend.vect._0_8_ = *(undefined8 *)local_f78;
      local_1098.smallend.vect[2] = local_f78[2];
      local_1098.bigend.vect[0] = local_f78[3];
      local_1098.bigend.vect._4_8_ = *(undefined8 *)(local_f78 + 4);
      local_1098.btype.itype = local_f78[6];
      uVar3 = local_ee4._4_4_;
      local_ee4 = uVar1;
      uVar4 = local_edc._4_4_;
      local_edc = uVar2;
      uVar1 = local_ee4;
      local_ee4._4_4_ = uVar3;
      uVar2 = local_edc;
      local_edc._4_4_ = uVar4;
      Box::grow(&local_1098,4);
      uVar2 = local_edc;
      uVar1 = local_ee4;
      uVar3 = local_ee4._4_4_;
      local_ee4 = uVar1;
      uVar4 = local_edc._4_4_;
      local_edc = uVar2;
      uVar1 = local_ee4;
      local_ee4._4_4_ = uVar3;
      uVar2 = local_edc;
      local_edc._4_4_ = uVar4;
      local_107c = EBCellFlagFab::getType
                             (in_stack_ffffffffffffe958,
                              (Box *)CONCAT44(in_stack_ffffffffffffe954,in_stack_ffffffffffffe950));
      uVar2 = local_edc;
      uVar1 = local_ee4;
      if (local_105c != covered) {
        uVar3 = local_ee4._4_4_;
        local_ee4 = uVar1;
        uVar4 = local_edc._4_4_;
        local_edc = uVar2;
        uVar1 = local_ee4;
        local_ee4._4_4_ = uVar3;
        uVar2 = local_edc;
        local_edc._4_4_ = uVar4;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffe844,in_stack_ffffffffffffe840),
                   (MFIter *)in_stack_ffffffffffffe838,
                   (int)((ulong)in_stack_ffffffffffffe830 >> 0x20));
        uVar2 = local_edc;
        uVar1 = local_ee4;
        local_10a0 = local_10e0;
        uVar3 = local_ee4._4_4_;
        local_ee4 = uVar1;
        uVar4 = local_edc._4_4_;
        local_edc = uVar2;
        uVar1 = local_ee4;
        local_ee4._4_4_ = uVar3;
        uVar2 = local_edc;
        local_edc._4_4_ = uVar4;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffe844,in_stack_ffffffffffffe840),
                   (MFIter *)in_stack_ffffffffffffe838,
                   (int)((ulong)in_stack_ffffffffffffe830 >> 0x20));
        uVar2 = local_edc;
        uVar1 = local_ee4;
        local_10e8 = local_1128;
        uVar3 = local_ee4._4_4_;
        local_ee4 = uVar1;
        uVar4 = local_edc._4_4_;
        local_edc = uVar2;
        uVar1 = local_ee4;
        local_ee4._4_4_ = uVar3;
        uVar2 = local_edc;
        local_edc._4_4_ = uVar4;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffe844,in_stack_ffffffffffffe840),
                   (MFIter *)in_stack_ffffffffffffe838,
                   (int)((ulong)in_stack_ffffffffffffe830 >> 0x20));
        uVar2 = local_edc;
        uVar1 = local_ee4;
        local_1130 = local_1170;
        local_ee4 = uVar1;
        local_edc = uVar2;
        if (local_107c == regular) {
          uVar3 = local_ee4._4_4_;
          uVar4 = local_edc._4_4_;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          local_1178 = local_11a0;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::begin
                    ((range_impl<amrex::Box> *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::end
                    ((range_impl<amrex::Box> *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          while (local_edc = uVar2, local_ee4 = uVar1, uVar4 = local_edc._4_4_,
                uVar3 = local_ee4._4_4_, uVar1 = local_ee4, local_ee4._4_4_ = uVar3,
                uVar2 = local_edc, local_edc._4_4_ = uVar4,
                bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (&local_11b8,&local_11d0), uVar2 = local_edc, uVar1 = local_ee4,
                local_ee4 = uVar1, local_edc = uVar2, bVar5) {
            uVar3 = local_ee4._4_4_;
            uVar4 = local_edc._4_4_;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_11ec,&local_11b8);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_d00 = local_1018;
            local_d08 = local_10a0;
            local_d18 = &local_eec;
            local_d20 = local_ef8;
            local_c = 0;
            local_cd4 = (undefined4)local_eec;
            local_1c = 1;
            uStack_cd0 = local_eec._4_4_;
            local_e08 = local_eec;
            local_2c = 2;
            local_e00._0_4_ = uVar1;
            local_38 = (long)&local_ee4 + 4;
            local_3c = 0;
            local_cac = local_ee4._4_4_;
            local_48 = (long)&local_ee4 + 4;
            local_4c = 1;
            uStack_ca8._0_4_ = uVar2;
            local_d60 = CONCAT84(uVar2,local_ee4._4_4_);
            local_58 = (long)&local_ee4 + 4;
            local_5c = 2;
            local_d58 = local_edc._4_4_;
            local_df8 = local_ef8;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            local_d4c = local_d60;
            local_d44 = local_d58;
            local_d40 = local_e08;
            local_d38._0_4_ = (undefined8)local_e00;
            local_d30 = local_e08;
            local_d28._0_4_ = (undefined8)local_e00;
            local_cf8 = &local_11ec;
            local_cf0 = local_e08;
            local_ce8._0_4_ = (undefined8)local_e00;
            local_ce0 = local_d18;
            local_ccc._0_4_ = (undefined4)(undefined8)local_e00;
            local_ccc._4_8_ = local_d60;
            local_cc0 = local_d58;
            local_cb8 = local_d18;
            uStack_ca8._4_4_ = local_d58;
            local_28 = local_d18;
            local_18 = local_d18;
            local_8 = local_d18;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_df0,local_10a0,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_db0,local_d00,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_d70 = local_d4c;
            local_d68 = local_d44;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Loop<amrex::eb_interp_cc2face_x(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                      (in_stack_ffffffffffffe888,(int)((ulong)in_stack_ffffffffffffe880 >> 0x20),
                       (anon_class_168_5_9f62599b *)
                       CONCAT44(in_stack_ffffffffffffe87c,in_stack_ffffffffffffe878));
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_11b8);
            uVar2 = local_edc;
            uVar1 = local_ee4;
          }
          uVar3 = local_ee4._4_4_;
          uVar4 = local_edc._4_4_;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          local_11f8 = local_1220;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::begin
                    ((range_impl<amrex::Box> *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::end
                    ((range_impl<amrex::Box> *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          while (local_edc = uVar2, local_ee4 = uVar1, uVar4 = local_edc._4_4_,
                uVar3 = local_ee4._4_4_, uVar1 = local_ee4, local_ee4._4_4_ = uVar3,
                uVar2 = local_edc, local_edc._4_4_ = uVar4,
                bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (&local_1238,&local_1250), uVar2 = local_edc, uVar1 = local_ee4,
                local_ee4 = uVar1, local_edc = uVar2, bVar5) {
            uVar3 = local_ee4._4_4_;
            uVar4 = local_edc._4_4_;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_126c,&local_1238);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_b98 = local_1018;
            local_ba0 = local_10e8;
            local_bb0 = &local_eec;
            local_bb8 = local_ef8;
            local_6c = 0;
            local_b6c = (undefined4)local_eec;
            local_7c = 1;
            uStack_b68 = local_eec._4_4_;
            local_ca0 = local_eec;
            local_8c = 2;
            local_c98._0_4_ = uVar1;
            local_98 = (long)&local_ee4 + 4;
            local_9c = 0;
            local_b44 = local_ee4._4_4_;
            local_a8 = (long)&local_ee4 + 4;
            local_ac = 1;
            uStack_b40._0_4_ = uVar2;
            local_bf8 = CONCAT84(uVar2,local_ee4._4_4_);
            local_b8 = (long)&local_ee4 + 4;
            local_bc = 2;
            local_bf0 = local_edc._4_4_;
            local_c90 = local_ef8;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            local_be4 = local_bf8;
            local_bdc = local_bf0;
            local_bd8 = local_ca0;
            local_bd0._0_4_ = (undefined8)local_c98;
            local_bc8 = local_ca0;
            local_bc0._0_4_ = (undefined8)local_c98;
            local_b90 = &local_126c;
            local_b88 = local_ca0;
            local_b80._0_4_ = (undefined8)local_c98;
            local_b78 = local_bb0;
            local_b64._0_4_ = (undefined4)(undefined8)local_c98;
            local_b64._4_8_ = local_bf8;
            local_b58 = local_bf0;
            local_b50 = local_bb0;
            uStack_b40._4_4_ = local_bf0;
            local_88 = local_bb0;
            local_78 = local_bb0;
            local_68 = local_bb0;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_c88,local_10e8,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_c48,local_b98,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_c08 = local_be4;
            local_c00 = local_bdc;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Loop<amrex::eb_interp_cc2face_y(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                      (in_stack_ffffffffffffe888,(int)((ulong)in_stack_ffffffffffffe880 >> 0x20),
                       (anon_class_168_5_9f625d5c *)
                       CONCAT44(in_stack_ffffffffffffe87c,in_stack_ffffffffffffe878));
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1238);
            uVar2 = local_edc;
            uVar1 = local_ee4;
          }
          uVar3 = local_ee4._4_4_;
          uVar4 = local_edc._4_4_;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          local_1278 = local_12a0;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::begin
                    ((range_impl<amrex::Box> *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::end
                    ((range_impl<amrex::Box> *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          while (local_edc = uVar2, local_ee4 = uVar1, uVar4 = local_edc._4_4_,
                uVar3 = local_ee4._4_4_, uVar1 = local_ee4, local_ee4._4_4_ = uVar3,
                uVar2 = local_edc, local_edc._4_4_ = uVar4,
                bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (&local_12b8,(iterator *)(local_12ec + 0x1c)), uVar2 = local_edc,
                uVar1 = local_ee4, bVar5) {
            in_stack_ffffffffffffe898 = (MFIter *)local_12ec;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                      ((Box *)in_stack_ffffffffffffe898,&local_12b8);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_a30 = local_1018;
            local_a38 = local_1130;
            local_a48 = &local_eec;
            local_a50 = local_ef8;
            local_cc = 0;
            local_a04 = (undefined4)local_eec;
            local_dc = 1;
            uStack_a00 = local_eec._4_4_;
            local_b38 = local_eec;
            local_ec = 2;
            local_b30._0_4_ = uVar1;
            local_f8 = (long)&local_ee4 + 4;
            local_fc = 0;
            local_9dc = local_ee4._4_4_;
            local_108 = (long)&local_ee4 + 4;
            local_10c = 1;
            uStack_9d8._0_4_ = uVar2;
            local_a90 = CONCAT84(uVar2,local_ee4._4_4_);
            local_118 = (long)&local_ee4 + 4;
            local_11c = 2;
            local_a88 = local_edc._4_4_;
            local_b28 = local_ef8;
            in_stack_ffffffffffffe8a0 = in_stack_ffffffffffffe898;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            local_a7c = local_a90;
            local_a74 = local_a88;
            local_a70 = local_b38;
            local_a68._0_4_ = (undefined8)local_b30;
            local_a60 = local_b38;
            local_a58._0_4_ = (undefined8)local_b30;
            local_a28 = in_stack_ffffffffffffe898;
            local_a20 = local_b38;
            local_a18._0_4_ = (undefined8)local_b30;
            local_a10 = local_a48;
            local_9fc._0_4_ = (undefined4)(undefined8)local_b30;
            local_9fc._4_8_ = local_a90;
            local_9f0 = local_a88;
            local_9e8 = local_a48;
            uStack_9d8._4_4_ = local_a88;
            local_e8 = local_a48;
            local_d8 = local_a48;
            local_c8 = local_a48;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_b20,local_1130,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_ae0,local_a30,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_aa0 = local_a7c;
            local_a98 = local_a74;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Loop<amrex::eb_interp_cc2face_z(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                      (in_stack_ffffffffffffe888,(int)((ulong)in_stack_ffffffffffffe880 >> 0x20),
                       (anon_class_168_5_9f62611d *)
                       CONCAT44(in_stack_ffffffffffffe87c,in_stack_ffffffffffffe878));
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_12b8);
            uVar2 = local_edc;
            uVar1 = local_ee4;
          }
        }
        else {
          uVar3 = local_ee4._4_4_;
          uVar4 = local_edc._4_4_;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe830,
                     (size_type)in_stack_ffffffffffffe828);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          MultiCutFab::const_array(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          local_12f8 = local_1338;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe830,
                     (size_type)in_stack_ffffffffffffe828);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          MultiCutFab::const_array(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          local_1340 = local_1380;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe830,
                     (size_type)in_stack_ffffffffffffe828);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          MultiCutFab::const_array(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          local_1388 = local_13c8;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe830,
                     (size_type)in_stack_ffffffffffffe828);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          MultiCutFab::const_array(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          local_13d0 = local_1410;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe830,
                     (size_type)in_stack_ffffffffffffe828);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          MultiCutFab::const_array(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          local_1418 = local_1458;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe830,
                     (size_type)in_stack_ffffffffffffe828);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          MultiCutFab::const_array(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          local_1460 = local_14a0;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffe838,(MFIter *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          local_14a8 = local_14e8;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          MultiCutFab::const_array(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          local_14f0 = local_1530;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          local_1538 = local_1560;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::begin
                    ((range_impl<amrex::Box> *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::end
                    ((range_impl<amrex::Box> *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          while (local_edc = uVar2, local_ee4 = uVar1, uVar4 = local_edc._4_4_,
                uVar3 = local_ee4._4_4_, uVar1 = local_ee4, local_ee4._4_4_ = uVar3,
                uVar2 = local_edc, local_edc._4_4_ = uVar4,
                bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (&local_1578,&local_1590), uVar2 = local_edc, uVar1 = local_ee4,
                local_ee4 = uVar1, local_edc = uVar2, bVar5) {
            in_stack_ffffffffffffe880 = (Box *)&stack0xffffffffffffea54;
            uVar3 = local_ee4._4_4_;
            uVar4 = local_edc._4_4_;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                      (in_stack_ffffffffffffe880,&local_1578);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_7a8 = local_1018;
            local_7b0 = local_12f8;
            local_7b8 = local_14a8;
            local_7c0 = local_14f0;
            local_7c8 = local_13d0;
            local_7d0 = local_10a0;
            local_7e0 = &local_eec;
            local_7e8 = local_ef8;
            local_12c = 0;
            local_77c = (undefined4)local_eec;
            local_13c = 1;
            uStack_778 = local_eec._4_4_;
            local_808 = local_eec;
            local_14c = 2;
            local_800._0_4_ = uVar1;
            local_158 = (long)&local_ee4 + 4;
            local_15c = 0;
            local_754 = local_ee4._4_4_;
            local_168 = (long)&local_ee4 + 4;
            local_16c = 1;
            uStack_750._0_4_ = uVar2;
            local_828 = CONCAT84(uVar2,local_ee4._4_4_);
            local_178 = (long)&local_ee4 + 4;
            local_17c = 2;
            local_820 = local_edc._4_4_;
            in_stack_ffffffffffffe888 = in_stack_ffffffffffffe880;
            in_stack_ffffffffffffe894 = in_stack_00000008;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            local_814 = local_828;
            local_80c = local_820;
            local_7f8 = local_808;
            local_7f0._0_4_ = (undefined8)local_800;
            local_7a0 = in_stack_ffffffffffffe880;
            local_798 = local_808;
            local_790._0_4_ = (undefined8)local_800;
            local_788 = local_7e0;
            local_774._0_4_ = (undefined4)(undefined8)local_800;
            local_774._4_8_ = local_828;
            local_768 = local_820;
            local_760 = local_7e0;
            uStack_750._4_4_ = local_820;
            local_148 = local_7e0;
            local_138 = local_7e0;
            local_128 = local_7e0;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(local_9d0,local_12f8,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_990,local_7d0,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_950 = local_7f8;
            local_948._0_4_ = (undefined8)local_7f0;
            local_940 = local_7e8;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_938,local_7a8,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_8f8 = local_814;
            local_8f0 = local_80c;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_8e8,local_7b8,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_8a8,local_7c0,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_868,local_7c8,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Loop<amrex::eb_interp_centroid2facecent_x(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                      (in_stack_ffffffffffffe888,(int)((ulong)in_stack_ffffffffffffe880 >> 0x20),
                       (anon_class_424_9_c4b22738 *)
                       CONCAT44(in_stack_ffffffffffffe87c,in_stack_ffffffffffffe878));
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1578);
            uVar2 = local_edc;
            uVar1 = local_ee4;
          }
          uVar3 = local_ee4._4_4_;
          uVar4 = local_edc._4_4_;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::begin
                    ((range_impl<amrex::Box> *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::end
                    ((range_impl<amrex::Box> *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          while (local_edc = uVar2, local_ee4 = uVar1, uVar4 = local_edc._4_4_,
                uVar3 = local_ee4._4_4_, uVar1 = local_ee4, local_ee4._4_4_ = uVar3,
                uVar2 = local_edc, local_edc._4_4_ = uVar4,
                bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (local_15f8,&local_1610), uVar2 = local_edc, uVar1 = local_ee4,
                local_ee4 = uVar1, local_edc = uVar2, bVar5) {
            uVar3 = local_ee4._4_4_;
            uVar4 = local_edc._4_4_;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_162c,local_15f8);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_520 = local_1018;
            local_528 = local_1340;
            local_530 = local_14a8;
            local_538 = local_14f0;
            local_540 = local_1418;
            local_548 = local_10e8;
            local_558 = &local_eec;
            local_560 = local_ef8;
            local_18c = 0;
            local_4f4 = (undefined4)local_eec;
            local_19c = 1;
            uStack_4f0 = local_eec._4_4_;
            local_580 = local_eec;
            local_1ac = 2;
            local_578._0_4_ = uVar1;
            local_1b8 = (long)&local_ee4 + 4;
            local_1bc = 0;
            local_4cc = local_ee4._4_4_;
            local_1c8 = (long)&local_ee4 + 4;
            local_1cc = 1;
            uStack_4c8._0_4_ = uVar2;
            local_5a0 = CONCAT84(uVar2,local_ee4._4_4_);
            local_1d8 = (long)&local_ee4 + 4;
            local_1dc = 2;
            local_598 = local_edc._4_4_;
            in_stack_ffffffffffffe87c = in_stack_00000008;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            local_58c = local_5a0;
            local_584 = local_598;
            local_570 = local_580;
            local_568._0_4_ = (undefined8)local_578;
            local_518 = &local_162c;
            local_510 = local_580;
            local_508._0_4_ = (undefined8)local_578;
            local_500 = local_558;
            local_4ec._0_4_ = (undefined4)(undefined8)local_578;
            local_4ec._4_8_ = local_5a0;
            local_4e0 = local_598;
            local_4d8 = local_558;
            uStack_4c8._4_4_ = local_598;
            local_1a8 = local_558;
            local_198 = local_558;
            local_188 = local_558;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(local_748,local_1340,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_708,local_548,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_6c8 = local_570;
            local_6c0._0_4_ = (undefined8)local_568;
            local_6b8 = local_560;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_6b0,local_520,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_670 = local_58c;
            local_668 = local_584;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_660,local_530,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_620,local_538,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_5e0,local_540,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Loop<amrex::eb_interp_centroid2facecent_y(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                      (in_stack_ffffffffffffe888,(int)((ulong)in_stack_ffffffffffffe880 >> 0x20),
                       (anon_class_424_9_c0d7c319 *)
                       CONCAT44(in_stack_ffffffffffffe87c,in_stack_ffffffffffffe878));
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(local_15f8);
            uVar2 = local_edc;
            uVar1 = local_ee4;
          }
          uVar3 = local_ee4._4_4_;
          uVar4 = local_edc._4_4_;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          local_1638 = local_1660;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::begin
                    ((range_impl<amrex::Box> *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          uVar3 = local_ee4._4_4_;
          local_ee4 = uVar1;
          uVar4 = local_edc._4_4_;
          local_edc = uVar2;
          uVar1 = local_ee4;
          local_ee4._4_4_ = uVar3;
          uVar2 = local_edc;
          local_edc._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::end
                    ((range_impl<amrex::Box> *)in_stack_ffffffffffffe830);
          uVar2 = local_edc;
          uVar1 = local_ee4;
          while (local_edc = uVar2, local_ee4 = uVar1, uVar4 = local_edc._4_4_,
                uVar3 = local_ee4._4_4_, uVar1 = local_ee4, local_ee4._4_4_ = uVar3,
                uVar2 = local_edc, local_edc._4_4_ = uVar4,
                bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (&local_1678,&local_1690), uVar2 = local_edc, uVar1 = local_ee4,
                bVar5) {
            in_stack_ffffffffffffe850 = (FabArray<amrex::FArrayBox> *)&stack0xffffffffffffe954;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                      ((Box *)in_stack_ffffffffffffe850,&local_1678);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_298 = local_1018;
            local_2a0 = local_1388;
            local_2a8 = local_14a8;
            local_2b0 = local_14f0;
            local_2b8 = local_1460;
            local_2c0 = local_1130;
            local_2d0 = &local_eec;
            local_2d8 = local_ef8;
            local_1ec = 0;
            local_26c = (undefined4)local_eec;
            local_1fc = 1;
            uStack_268 = local_eec._4_4_;
            local_2f8 = local_eec;
            local_20c = 2;
            local_2f0._0_4_ = uVar1;
            local_218 = (long)&local_ee4 + 4;
            local_21c = 0;
            local_248 = local_ee4._4_4_;
            local_228 = (long)&local_ee4 + 4;
            local_22c = 1;
            uStack_244._0_4_ = uVar2;
            local_318 = CONCAT84(uVar2,local_ee4._4_4_);
            local_238 = (long)&local_ee4 + 4;
            local_23c = 2;
            local_310 = local_edc._4_4_;
            in_stack_ffffffffffffe864 = in_stack_00000008;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            local_304 = local_318;
            local_2fc = local_310;
            local_2e8 = local_2f8;
            local_2e0._0_4_ = (undefined8)local_2f0;
            local_290 = in_stack_ffffffffffffe850;
            local_288 = local_2f8;
            local_280._0_4_ = (undefined8)local_2f0;
            local_278 = local_2d0;
            local_264._0_4_ = (undefined4)(undefined8)local_2f0;
            local_264._4_8_ = local_318;
            local_258 = local_310;
            local_250 = local_2d0;
            uStack_244._4_4_ = local_310;
            local_208 = local_2d0;
            local_1f8 = local_2d0;
            local_1e8 = local_2d0;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(local_4c0,local_1388,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_480,local_2c0,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_440 = local_2e8;
            local_438._0_4_ = (undefined8)local_2e0;
            local_430 = local_2d8;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_428,local_298,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            local_3e8 = local_304;
            local_3e0 = local_2fc;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_3d8,local_2a8,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_398,local_2b0,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            memcpy(auStack_358,local_2b8,0x3c);
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Loop<amrex::eb_interp_centroid2facecent_z(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                      (in_stack_ffffffffffffe888,(int)((ulong)in_stack_ffffffffffffe880 >> 0x20),
                       (anon_class_424_9_bcfd5efa *)
                       CONCAT44(in_stack_ffffffffffffe87c,in_stack_ffffffffffffe878));
            uVar2 = local_edc;
            uVar1 = local_ee4;
            uVar3 = local_ee4._4_4_;
            local_ee4 = uVar1;
            uVar4 = local_edc._4_4_;
            local_edc = uVar2;
            uVar1 = local_ee4;
            local_ee4._4_4_ = uVar3;
            uVar2 = local_edc;
            local_edc._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1678);
            uVar2 = local_edc;
            uVar1 = local_ee4;
          }
        }
      }
      local_edc = uVar2;
      local_ee4 = uVar1;
      uVar4 = local_edc._4_4_;
      uVar3 = local_ee4._4_4_;
      uVar1 = local_ee4;
      local_ee4._4_4_ = uVar3;
      uVar2 = local_edc;
      local_edc._4_4_ = uVar4;
      MFIter::operator++(&local_f70);
      uVar2 = local_edc;
      uVar1 = local_ee4;
    }
    uVar3 = local_ee4._4_4_;
    uVar4 = local_edc._4_4_;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    MFIter::~MFIter((MFIter *)in_stack_ffffffffffffe830);
    uVar2 = local_edc;
    uVar1 = local_ee4;
    uVar3 = local_ee4._4_4_;
    local_ee4 = uVar1;
    uVar4 = local_edc._4_4_;
    local_edc = uVar2;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    Geometry::periodicity((Geometry *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860))
    ;
    uVar2 = local_edc;
    uVar1 = local_ee4;
    cross = 0;
    uVar3 = local_ee4._4_4_;
    local_ee4 = uVar1;
    uVar4 = local_edc._4_4_;
    local_edc = uVar2;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_ffffffffffffe850,in_stack_ffffffffffffe848,false);
    uVar2 = local_edc;
    uVar1 = local_ee4;
    uVar3 = local_ee4._4_4_;
    local_ee4 = uVar1;
    uVar4 = local_edc._4_4_;
    local_edc = uVar2;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    Geometry::periodicity((Geometry *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860))
    ;
    uVar2 = local_edc;
    uVar1 = local_ee4;
    uVar3 = local_ee4._4_4_;
    local_ee4 = uVar1;
    uVar4 = local_edc._4_4_;
    local_edc = uVar2;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_ffffffffffffe850,in_stack_ffffffffffffe848,(bool)cross);
    uVar2 = local_edc;
    uVar1 = local_ee4;
    uVar3 = local_ee4._4_4_;
    local_ee4 = uVar1;
    uVar4 = local_edc._4_4_;
    local_edc = uVar2;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    Geometry::periodicity((Geometry *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860))
    ;
    uVar2 = local_edc;
    uVar1 = local_ee4;
    uVar3 = local_ee4._4_4_;
    local_ee4 = uVar1;
    uVar4 = local_edc._4_4_;
    local_edc = uVar2;
    uVar1 = local_ee4;
    local_ee4._4_4_ = uVar3;
    uVar2 = local_edc;
    local_edc._4_4_ = uVar4;
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_ffffffffffffe850,local_e68,(bool)cross);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
EB_interp_CellCentroid_to_FaceCentroid (const MultiFab& phi_centroid,
                                        AMREX_D_DECL( MultiFab& phi_xface,
                                                      MultiFab& phi_yface,
                                                      MultiFab& phi_zface),
                                        int scomp, int dcomp, int ncomp,
                                        const Geometry& a_geom,
                                        const Vector<BCRec>& a_bcs)
{
    const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(phi_centroid.Factory());
    const auto& flags = factory.getMultiEBCellFlagFab();
    const auto& vfrac = factory.getVolFrac();
    const auto& area  = factory.getAreaFrac();
    const auto& fcent = factory.getFaceCent();
    const auto& ccent = factory.getCentroid();

    // We assume that we start from the first component of bcs ... we may need to generalize this
    AMREX_ALWAYS_ASSERT(a_bcs.size() >= ncomp );

    Box domain(a_geom.Domain());

    const int nghost(4);

   // Initialize edge state
    AMREX_D_TERM(phi_xface.setVal(1e40,dcomp,ncomp);,
                 phi_yface.setVal(1e40,dcomp,ncomp);,
                 phi_zface.setVal(1e40,dcomp,ncomp));

    BCRec const* d_bcs;
#ifdef AMREX_USE_GPU
    Gpu::DeviceVector<BCRec> dv_bcs(ncomp);
    if (Gpu::inLaunchRegion())
    {
        Gpu::copy(Gpu::hostToDevice, a_bcs.begin(), a_bcs.begin()+ncomp, dv_bcs.begin());
        d_bcs = dv_bcs.dataPtr();
    }
    else
#endif
    {
        d_bcs = a_bcs.dataPtr();
    }

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi_centroid, mfi_info);  mfi.isValid(); ++mfi)
    {
        const Box& vbx = mfi.tilebox();
        AMREX_D_TERM(const Box& xbx = mfi.nodaltilebox(0);,
                     const Box& ybx = mfi.nodaltilebox(1);,
                     const Box& zbx = mfi.nodaltilebox(2));
        const auto& ccfab = phi_centroid.array(mfi,scomp);
        const auto fabtyp = flags[mfi].getType(amrex::grow(vbx,0));
        const auto fabtyp_ghost = flags[mfi].getType(amrex::grow(vbx,nghost));

        if (fabtyp != FabType::covered)
        {
            AMREX_D_TERM(Array4<Real> const& phi_x = phi_xface.array(mfi,dcomp);,
                         Array4<Real> const& phi_y = phi_yface.array(mfi,dcomp);,
                         Array4<Real> const& phi_z = phi_zface.array(mfi,dcomp));

            if (fabtyp_ghost == FabType::regular )
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, txbx,
                     {
                         eb_interp_cc2face_x(txbx, ccfab, phi_x, ncomp, domain, d_bcs);
                     },
                     ybx, tybx,
                     {
                         eb_interp_cc2face_y(tybx, ccfab, phi_y, ncomp, domain, d_bcs);
                     },
                     zbx, tzbx,
                     {
                         eb_interp_cc2face_z(tzbx, ccfab, phi_z, ncomp, domain, d_bcs);
                     });
            }
            else
            {
                AMREX_D_TERM(Array4<Real const> const& apxfab = area[0]->const_array(mfi);,
                             Array4<Real const> const& apyfab = area[1]->const_array(mfi);,
                             Array4<Real const> const& apzfab = area[2]->const_array(mfi));

                AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                             Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                             Array4<Real const> const& fcz = fcent[2]->const_array(mfi));

                Array4<Real const> const& cvol = vfrac.const_array(mfi);
                Array4<Real const> const& cct  = ccent.const_array(mfi);

                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, txbx,
                     {
                         eb_interp_centroid2facecent_x(txbx, ccfab, apxfab, cvol, cct, fcx, phi_x,
                                                       ncomp, domain, d_bcs);
                     },
                     ybx, tybx,
                     {
                         eb_interp_centroid2facecent_y(tybx, ccfab, apyfab, cvol, cct, fcy, phi_y,
                                                       ncomp, domain, d_bcs);
                     },
                     zbx, tzbx,
                     {
                         eb_interp_centroid2facecent_z(tzbx, ccfab, apzfab, cvol, cct, fcz, phi_z,
                                                       ncomp, domain, d_bcs);
                     });
            }
        }
    }

    phi_xface.FillBoundary(a_geom.periodicity());
    phi_yface.FillBoundary(a_geom.periodicity());
#if ( AMREX_SPACEDIM == 3 )
    phi_zface.FillBoundary(a_geom.periodicity());
#endif

}